

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::fallback_format<long_double>
               (longdouble d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  int *in_RCX;
  buffer<char> *in_RDX;
  byte in_SIL;
  int in_EDI;
  bool bVar7;
  unkbyte10 in_stack_00000008;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_2;
  int i;
  int result_1;
  bool high;
  bool low;
  int digit_1;
  char *data;
  bool even;
  uint64_t significand;
  int shift;
  bool is_predecessor_closer;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  undefined2 in_stack_fffffffffffffbf0;
  undefined6 in_stack_fffffffffffffbf2;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  bigint *in_stack_fffffffffffffc00;
  undefined2 in_stack_fffffffffffffc08;
  undefined6 in_stack_fffffffffffffc0a;
  bigint *in_stack_fffffffffffffc10;
  bigint *in_stack_fffffffffffffc18;
  bigint *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  bigint *in_stack_fffffffffffffc38;
  bool local_366;
  int local_360;
  int local_354;
  char local_350;
  int local_34c;
  fp local_318;
  undefined1 *local_308;
  undefined1 local_300 [176];
  undefined1 local_250 [544];
  int *local_30;
  buffer<char> *local_28;
  byte local_1d;
  int local_1c;
  unkbyte10 local_18;
  
  local_18 = in_stack_00000008;
  local_1d = in_SIL & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_1c = in_EDI;
  bigint::bigint(in_stack_fffffffffffffc10);
  bigint::bigint(in_stack_fffffffffffffc10);
  bigint::bigint(in_stack_fffffffffffffc10);
  bigint::bigint(in_stack_fffffffffffffc10);
  local_308 = (undefined1 *)0x0;
  fp::fp(&local_318);
  if ((local_1d & 1) == 0) {
    in_stack_fffffffffffffbe8 = (undefined4)local_18;
    in_stack_fffffffffffffbec = (int)((unkuint10)local_18 >> 0x20);
    in_stack_fffffffffffffbf0 = (undefined2)((unkuint10)local_18 >> 0x40);
    local_366 = fp::assign<long_double,_0>
                          ((fp *)in_stack_fffffffffffffc10,
                           (longdouble)CONCAT28(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00)
                          );
  }
  else {
    local_366 = fp::assign<float,_0>
                          ((fp *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                           (float)((ulong)in_stack_fffffffffffffc28 >> 0x20));
  }
  iVar2 = 1;
  if (local_366 != false) {
    iVar2 = 2;
  }
  if (local_318.e < 0) {
    if (*local_30 < 0) {
      bigint::assign_pow10
                ((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbec);
      bigint::assign(in_stack_fffffffffffffc10,
                     (bigint *)CONCAT62(in_stack_fffffffffffffc0a,in_stack_fffffffffffffc08));
      if (iVar2 != 1) {
        bigint::assign(in_stack_fffffffffffffc10,
                       (bigint *)CONCAT62(in_stack_fffffffffffffc0a,in_stack_fffffffffffffc08));
        bigint::operator<<=(in_stack_fffffffffffffc18,
                            (int)((ulong)in_stack_fffffffffffffc10 >> 0x20));
        local_308 = local_300;
      }
      iVar2 = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
      bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      bigint::assign(in_stack_fffffffffffffc00,
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      bigint::operator<<=(in_stack_fffffffffffffc18,iVar2);
    }
    else {
      bigint::assign(in_stack_fffffffffffffc00,
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      iVar3 = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
      bigint::assign_pow10
                ((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbec);
      bigint::operator<<=(in_stack_fffffffffffffc18,iVar3);
      bigint::assign(in_stack_fffffffffffffc00,
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      if (iVar2 != 1) {
        bigint::assign(in_stack_fffffffffffffc00,
                       CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        local_308 = local_300;
      }
    }
  }
  else {
    bigint::assign(in_stack_fffffffffffffc00,
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    iVar3 = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
    bigint::operator<<=(in_stack_fffffffffffffc18,iVar3);
    bigint::assign(in_stack_fffffffffffffc00,
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    bigint::operator<<=(in_stack_fffffffffffffc18,iVar3);
    if (iVar2 != 1) {
      bigint::assign(in_stack_fffffffffffffc00,
                     CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      bigint::operator<<=(in_stack_fffffffffffffc18,iVar3);
      local_308 = local_300;
    }
    bigint::assign_pow10
              ((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbec);
    bigint::operator<<=(in_stack_fffffffffffffc18,iVar3);
  }
  if (local_1c < 0) {
    if (local_308 == (undefined1 *)0x0) {
      local_308 = local_250;
    }
    bVar7 = (local_318.f & 1) == 0;
    local_1c = 0;
    pcVar5 = buffer<char>::data(local_28);
    while( true ) {
      iVar2 = bigint::divmod_assign
                        ((bigint *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                         (bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0));
      iVar3 = compare((bigint *)CONCAT62(in_stack_fffffffffffffc0a,in_stack_fffffffffffffc08),
                      in_stack_fffffffffffffc00);
      iVar3 = iVar3 - (uint)bVar7;
      iVar4 = add_compare(in_stack_fffffffffffffc38,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc28);
      bVar1 = 0 < (int)(iVar4 + (uint)bVar7);
      iVar4 = local_1c + 1;
      pcVar5[local_1c] = (char)iVar2 + '0';
      if ((iVar3 < 0) || (bVar1)) break;
      local_1c = iVar4;
      bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                         in_stack_fffffffffffffbec);
      bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                         in_stack_fffffffffffffbec);
      if (local_308 != local_250) {
        bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                           in_stack_fffffffffffffbec);
      }
    }
    if (iVar3 < 0) {
      local_1c = iVar4;
      if ((bVar1) &&
         ((iVar3 = add_compare(in_stack_fffffffffffffc38,
                               (bigint *)
                               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                               in_stack_fffffffffffffc28), 0 < iVar3 ||
          ((iVar3 == 0 && (iVar2 % 2 != 0)))))) {
        pcVar5[local_1c + -1] = pcVar5[local_1c + -1] + '\x01';
      }
    }
    else {
      pcVar5[local_1c] = pcVar5[local_1c] + '\x01';
      local_1c = iVar4;
    }
    to_unsigned<int>(local_1c);
    buffer<char>::try_resize
              ((buffer<char> *)in_stack_fffffffffffffc00,
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    *local_30 = *local_30 - (local_1c + -1);
  }
  else {
    *local_30 = *local_30 - (local_1c + -1);
    if (local_1c == 0) {
      buffer<char>::try_resize
                ((buffer<char> *)in_stack_fffffffffffffc00,
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                         in_stack_fffffffffffffbec);
      iVar2 = add_compare(in_stack_fffffffffffffc38,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc28);
      pbVar6 = (byte *)buffer<char>::operator[]<int>(local_28,0);
      *pbVar6 = 0 < iVar2 | 0x30;
    }
    else {
      to_unsigned<int>(local_1c);
      buffer<char>::try_resize
                ((buffer<char> *)in_stack_fffffffffffffc00,
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      for (local_34c = 0; local_34c < local_1c + -1; local_34c = local_34c + 1) {
        iVar2 = bigint::divmod_assign
                          ((bigint *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                           (bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0));
        local_350 = (char)iVar2;
        pcVar5 = buffer<char>::operator[]<int>(local_28,local_34c);
        *pcVar5 = local_350 + '0';
        bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0),
                           in_stack_fffffffffffffbec);
      }
      local_354 = bigint::divmod_assign
                            ((bigint *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8)
                             ,(bigint *)
                              CONCAT62(in_stack_fffffffffffffbf2,in_stack_fffffffffffffbf0));
      iVar2 = add_compare(in_stack_fffffffffffffc38,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc28);
      if ((0 < iVar2) || ((iVar2 == 0 && (local_354 % 2 != 0)))) {
        if (local_354 == 9) {
          pcVar5 = buffer<char>::operator[]<int>(local_28,local_1c + -1);
          *pcVar5 = ':';
          iVar2 = local_1c;
          while( true ) {
            local_360 = iVar2 + -1;
            bVar7 = false;
            if (0 < local_360) {
              pcVar5 = buffer<char>::operator[]<int>(local_28,local_360);
              bVar7 = *pcVar5 == ':';
            }
            if (!bVar7) break;
            pcVar5 = buffer<char>::operator[]<int>(local_28,local_360);
            *pcVar5 = '0';
            pcVar5 = buffer<char>::operator[]<int>(local_28,iVar2 + -2);
            *pcVar5 = *pcVar5 + '\x01';
            iVar2 = local_360;
          }
          pcVar5 = buffer<char>::operator[]<int>(local_28,0);
          if (*pcVar5 == ':') {
            pcVar5 = buffer<char>::operator[]<int>(local_28,0);
            *pcVar5 = '1';
            *local_30 = *local_30 + 1;
          }
          goto LAB_001bd2de;
        }
        local_354 = local_354 + 1;
      }
      local_354._0_1_ = (char)local_354 + '0';
      pcVar5 = buffer<char>::operator[]<int>(local_28,local_1c + -1);
      *pcVar5 = (char)local_354;
    }
  }
LAB_001bd2de:
  bigint::~bigint((bigint *)0x1bd2eb);
  bigint::~bigint((bigint *)0x1bd2f8);
  bigint::~bigint((bigint *)0x1bd305);
  bigint::~bigint((bigint *)0x1bd312);
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}